

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

string * testing::internal::StreamableToString<wchar_t*>(wchar_t **streamable)

{
  Message *in_RSI;
  string *in_RDI;
  Message *unaff_retaddr;
  Message *this;
  Message local_18;
  string *wide_c_str;
  
  this = &local_18;
  wide_c_str = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<(unaff_retaddr,(wchar_t *)wide_c_str);
  Message::GetString_abi_cxx11_(this);
  Message::~Message((Message *)0x5af07c);
  return in_RDI;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}